

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

VoidPromiseAndPipeline * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::startCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,RpcConnectionState *this,
          uint64_t interfaceId,uint64_t methodId,Own<capnp::ClientHook> *capability,
          Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  CallContextHook *pCVar2;
  WirePointer *pWVar3;
  PromiseNode *pPVar4;
  undefined8 uVar5;
  int iVar6;
  TransformPromiseNodeBase *this_00;
  RpcConnectionState *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VoidPromiseAndPipeline *pVVar7;
  PipelineHook *extraout_RDX;
  WirePointer *pWVar8;
  CapTableReader *pCVar9;
  Own<capnp::PipelineHook> OVar10;
  MessageSizeCounts MVar11;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> promises;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  request;
  ReaderFor<capnp::Persistent<>::SaveParams> params;
  Own<kj::_::PromiseNode> local_128;
  undefined1 local_118 [16];
  WirePointer *pWStack_108;
  undefined1 local_f8 [24];
  WirePointer *pWStack_e0;
  StructDataBitCount local_d8;
  StructPointerCount SStack_d4;
  undefined2 uStack_d2;
  int iStack_d0;
  undefined4 uStack_cc;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  local_c8;
  VoidPromiseAndPipeline *local_88;
  Disposer *local_80;
  undefined1 local_78 [16];
  WirePointer *pWStack_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  int iStack_50;
  undefined4 uStack_4c;
  Maybe<capnp::MessageSize> local_48;
  
  if ((interfaceId != 0xc8cb212fcd9f5691 || methodId != 0) || ((this->gateway).ptr.isSet != true)) {
    iVar6 = (*capability->ptr->_vptr_ClientHook[1])
                      (__return_storage_ptr__,capability->ptr,interfaceId,methodId & 0xffff,context)
    ;
    return (VoidPromiseAndPipeline *)CONCAT44(extraout_var_01,iVar6);
  }
  (*capability->ptr->_vptr_ClientHook[3])(&local_c8);
  local_78[0] = (char)local_c8.super_Builder._builder.segment;
  if ((char)local_c8.super_Builder._builder.segment == '\x01') {
    local_78._8_8_ = local_c8.super_Builder._builder.capTable;
    pWStack_68 = (WirePointer *)local_c8.super_Builder._builder.data;
    local_80 = context->disposer;
    pCVar2 = context->ptr;
    context->ptr = (CallContextHook *)0x0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x50);
    local_88 = __return_storage_ptr__;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)(local_78 + 8),
               kj::
               CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>
               ::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00621428;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    this_00[1].dependency.disposer = (Disposer *)0xc8cb212fcd9f5691;
    this_00[1].dependency.ptr = (PromiseNode *)0x0;
    this_00[1].continuationTracePtr = local_80;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pCVar2;
    local_128.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>>
          ::instance;
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    pWVar8 = (WirePointer *)capability->disposer;
    pWVar3 = (WirePointer *)capability->ptr;
    capability->ptr = (ClientHook *)0x0;
    local_128.ptr = (PromiseNode *)this_00;
    local_c8.super_Builder._builder.segment = (SegmentBuilder *)&this->super_Refcounted;
    local_c8.super_Builder._builder.capTable = (CapTableBuilder *)this;
    local_c8.super_Builder._builder.data = pWVar8;
    local_c8.super_Builder._builder.pointers = pWVar3;
    this_01 = (RpcConnectionState *)operator_new(0x38);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
              ((AttachmentPromiseNodeBase *)this_01,&local_128);
    (this_01->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR_onReady_006214b0;
    this_01->bootstrapFactory = (BootstrapFactoryBase *)&this->super_Refcounted;
    *(RpcConnectionState **)&(this_01->gateway).ptr = this;
    (this_01->gateway).ptr.field_1.value._vptr_Client = (_func_int **)pWVar8;
    *(WirePointer **)((long)&(this_01->gateway).ptr.field_1 + 8) = pWVar3;
    local_118._0_8_ =
         &kj::_::
          HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>>>
          ::instance;
    local_118._8_8_ = this_01;
    kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::split
              ((SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *
               )local_f8,
               (Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)local_118
              );
    pVVar7 = local_88;
    uVar5 = local_118._8_8_;
    if ((RpcConnectionState *)local_118._8_8_ != (RpcConnectionState *)0x0) {
      local_118._8_8_ = (RpcConnectionState *)0x0;
      (*(code *)((SegmentReader *)local_118._0_8_)->arena->_vptr_Arena)
                (local_118._0_8_,
                 ((ErrorHandler *)uVar5)->_vptr_ErrorHandler[-2] +
                 (long)&((ErrorHandler *)uVar5)->_vptr_ErrorHandler);
    }
    pPVar4 = local_128.ptr;
    if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
      local_128.ptr = (PromiseNode *)0x0;
      (**(local_128.disposer)->_vptr_Disposer)
                (local_128.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    (pVVar7->promise).super_PromiseBase.node.disposer = (Disposer *)local_f8._0_8_;
    (pVVar7->promise).super_PromiseBase.node.ptr = (PromiseNode *)local_f8._8_8_;
    local_f8._8_8_ = (CapTableReader *)0x0;
    OVar10 = newLocalPromisePipeline
                       ((capnp *)&pVVar7->pipeline,
                        (Promise<kj::Own<capnp::PipelineHook>_> *)(local_f8 + 0x10));
    pWVar8 = pWStack_e0;
    if (pWStack_e0 != (WirePointer *)0x0) {
      pWStack_e0 = (WirePointer *)0x0;
      iVar6 = (**(_func_int **)*(WirePointer *)local_f8._16_8_)
                        (local_f8._16_8_,
                         *(_func_int **)((long)*pWVar8 + -0x10) + (long)&pWVar8->offsetAndKind,
                         OVar10.ptr);
      OVar10.disposer._4_4_ = extraout_var;
      OVar10.disposer._0_4_ = iVar6;
      OVar10.ptr = extraout_RDX;
    }
    uVar5 = local_f8._8_8_;
    pVVar7 = (VoidPromiseAndPipeline *)OVar10.disposer;
    if ((CapTableReader *)local_f8._8_8_ != (CapTableReader *)0x0) {
      local_f8._8_8_ = (CapTableReader *)0x0;
      iVar6 = (*(code *)((SegmentReader *)local_f8._0_8_)->arena->_vptr_Arena)
                        (local_f8._0_8_,(*(_func_int ***)uVar5)[-2] + (long)(_func_int ***)uVar5);
      pVVar7 = (VoidPromiseAndPipeline *)CONCAT44(extraout_var_00,iVar6);
    }
    pWVar8 = pWStack_68;
    if (local_78[0] != '\x01') {
      return pVVar7;
    }
    if (pWStack_68 == (WirePointer *)0x0) {
      return pVVar7;
    }
    pWStack_68 = (WirePointer *)0x0;
    pCVar9 = (CapTableReader *)local_78._8_8_;
  }
  else {
    iVar6 = (*capability->ptr->_vptr_ClientHook[5])();
    if ((RpcConnectionState *)CONCAT44(extraout_var_02,iVar6) == this) {
      pVVar7 = RpcClient::callNoIntercept
                         (__return_storage_ptr__,(RpcClient *)capability->ptr,0xc8cb212fcd9f5691,0,
                          context);
      return pVVar7;
    }
    (**context->ptr->_vptr_CallContextHook)(local_f8);
    local_c8.super_Builder._builder.data = (void *)local_f8._16_8_;
    local_c8.super_Builder._builder.pointers = pWStack_e0;
    local_c8.super_Builder._builder.segment = (SegmentBuilder *)local_f8._0_8_;
    local_c8.super_Builder._builder.capTable = (CapTableBuilder *)local_f8._8_8_;
    PointerReader::getStruct((StructReader *)local_78,(PointerReader *)&local_c8,(word *)0x0);
    MVar11 = StructReader::totalSize((StructReader *)local_78);
    local_48.ptr.field_1.value.capCount = MVar11.capCount + 1;
    local_48.ptr.field_1.value.wordCount = MVar11.wordCount + 2;
    local_48.ptr.isSet = true;
    RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client
    ::exportRequest(&local_c8,&(this->gateway).ptr.field_1.value,&local_48);
    (*capability->ptr->_vptr_ClientHook[4])(&local_128);
    local_118._8_8_ = local_128.disposer;
    pWStack_108 = (WirePointer *)local_128.ptr;
    local_128.ptr = (PromiseNode *)0x0;
    local_118._0_8_ = &Persistent<capnp::AnyPointer,capnp::AnyPointer>::Client::typeinfo;
    local_f8._0_8_ = local_c8.super_Builder._builder.segment;
    local_f8._8_8_ = local_c8.super_Builder._builder.capTable;
    local_f8._16_8_ = local_c8.super_Builder._builder.pointers;
    PointerBuilder::setCapability
              ((PointerBuilder *)local_f8,(Own<capnp::ClientHook> *)(local_118 + 8));
    pWVar8 = pWStack_108;
    if (pWStack_108 != (WirePointer *)0x0) {
      pWStack_108 = (WirePointer *)0x0;
      (***(_func_int ***)local_118._8_8_)
                (local_118._8_8_,
                 *(_func_int **)((long)*pWVar8 + -0x10) + (long)&pWVar8->offsetAndKind);
    }
    pPVar4 = local_128.ptr;
    if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
      local_128.ptr = (PromiseNode *)0x0;
      (**(local_128.disposer)->_vptr_Disposer)
                (local_128.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    local_f8._0_8_ = CONCAT71(local_78._1_7_,local_78[0]);
    local_d8 = local_58;
    SStack_d4 = SStack_54;
    uStack_d2 = uStack_52;
    iStack_d0 = iStack_50;
    uStack_cc = uStack_4c;
    local_f8._16_8_ = pWStack_68;
    pWStack_e0 = pWStack_60;
    local_f8._8_8_ = local_78._8_8_;
    pWStack_108 = local_c8.super_Builder._builder.pointers + 1;
    local_118._0_8_ = local_c8.super_Builder._builder.segment;
    local_118._8_8_ = local_c8.super_Builder._builder.capTable;
    PointerBuilder::setStruct((PointerBuilder *)local_118,(StructReader *)local_f8,false);
    (*context->ptr->_vptr_CallContextHook[4])();
    (*context->ptr->_vptr_CallContextHook[1])();
    local_f8._4_4_ = local_c8.hook.disposer._4_4_;
    local_f8._0_4_ = local_c8.hook.disposer._0_4_;
    local_f8._8_8_ = local_c8.hook.ptr;
    local_c8.hook.ptr = (RequestHook *)0x0;
    iVar6 = (*context->ptr->_vptr_CallContextHook[6])(__return_storage_ptr__);
    uVar5 = local_f8._8_8_;
    pVVar7 = (VoidPromiseAndPipeline *)CONCAT44(extraout_var_03,iVar6);
    if ((CapTableReader *)local_f8._8_8_ != (CapTableReader *)0x0) {
      local_f8._8_8_ = (CapTableReader *)0x0;
      iVar6 = (*(code *)((SegmentReader *)local_f8._0_8_)->arena->_vptr_Arena)
                        (local_f8._0_8_,(*(_func_int ***)uVar5)[-2] + (long)(_func_int ***)uVar5);
      pVVar7 = (VoidPromiseAndPipeline *)CONCAT44(extraout_var_04,iVar6);
    }
    pWVar8 = (WirePointer *)local_c8.hook.ptr;
    if (local_c8.hook.ptr == (RequestHook *)0x0) {
      return pVVar7;
    }
    local_c8.hook.ptr = (RequestHook *)0x0;
    pCVar9 = (CapTableReader *)CONCAT44(local_c8.hook.disposer._4_4_,local_c8.hook.disposer._0_4_);
  }
  iVar6 = (**((CapTableReader *)&pCVar9->_vptr_CapTableReader)->_vptr_CapTableReader)
                    (pCVar9,((RequestHook *)pWVar8)->_vptr_RequestHook[-2] +
                            (long)&((RequestHook *)pWVar8)->_vptr_RequestHook);
  return (VoidPromiseAndPipeline *)CONCAT44(extraout_var_05,iVar6);
}

Assistant:

ClientHook::VoidPromiseAndPipeline startCall(
      uint64_t interfaceId, uint64_t methodId,
      kj::Own<ClientHook>&& capability, kj::Own<CallContextHook>&& context) {
    if (interfaceId == typeId<Persistent<>>() && methodId == 0) {
      KJ_IF_MAYBE(g, gateway) {
        // Wait, this is a call to Persistent.save() and we need to translate it through our
        // gateway.

        KJ_IF_MAYBE(resolvedPromise, capability->whenMoreResolved()) {
          // The plot thickens: We're looking at a promise capability. It could end up resolving
          // to a capability outside the gateway, in which case we don't want to translate at all.

          auto promises = resolvedPromise->then(kj::mvCapture(context,
              [this,interfaceId,methodId](kj::Own<CallContextHook>&& context,
                                          kj::Own<ClientHook> resolvedCap) {
            auto vpap = startCall(interfaceId, methodId, kj::mv(resolvedCap), kj::mv(context));
            return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
          })).attach(addRef(*this), kj::mv(capability)).split();

          return {
            kj::mv(kj::get<0>(promises)),
            newLocalPromisePipeline(kj::mv(kj::get<1>(promises))),
          };
        }

        if (capability->getBrand() == this) {
          // This capability is one of our own, pointing back out over the network. That means
          // that it would be inappropriate to apply the gateway transformation. We just want to
          // reflect the call back.
          return kj::downcast<RpcClient>(*capability)
              .callNoIntercept(interfaceId, methodId, kj::mv(context));
        }

        auto params = context->getParams().getAs<Persistent<>::SaveParams>();

        auto requestSize = params.totalSize();
        ++requestSize.capCount;
        requestSize.wordCount += sizeInWords<RealmGateway<>::ExportParams>();

        auto request = g->exportRequest(requestSize);
        request.setCap(Persistent<>::Client(capability->addRef()));
        request.setParams(params);

        context->allowCancellation();
        context->releaseParams();
        return context->directTailCall(RequestHook::from(kj::mv(request)));
      }
    }

    return capability->call(interfaceId, methodId, kj::mv(context));
  }